

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O3

void h2v2_smooth_downsample
               (j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY output_data)

{
  uint uVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  JSAMPROW pJVar16;
  long lVar17;
  ulong uVar18;
  
  iVar6 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  iVar7 = cinfo->max_v_samp_factor;
  if (-2 < iVar7) {
    uVar1 = cinfo->image_width;
    iVar8 = iVar6 * 2;
    if (0 < (int)(iVar8 - uVar1)) {
      uVar18 = 0;
      do {
        memset(input_data[uVar18 - 1] + uVar1,(uint)input_data[uVar18 - 1][(ulong)uVar1 - 1],
               (ulong)(iVar8 + ~uVar1) + 1);
        uVar18 = uVar18 + 1;
      } while (iVar7 + 2 != uVar18);
      iVar7 = cinfo->max_v_samp_factor;
    }
  }
  if (0 < iVar7) {
    iVar7 = cinfo->smoothing_factor * 0x10;
    iVar8 = cinfo->smoothing_factor * -0x50 + 0x4000;
    iVar6 = iVar6 + -2;
    lVar9 = 0;
    lVar11 = 0;
    do {
      pbVar2 = input_data[lVar11 + -1];
      pbVar3 = input_data[lVar11];
      pbVar4 = input_data[lVar11 + 1];
      pbVar5 = input_data[lVar11 + 2];
      pJVar16 = output_data[lVar9];
      *pJVar16 = (JSAMPLE)(((uint)pbVar4[1] + (uint)pbVar3[1] + (uint)*pbVar4 + (uint)*pbVar3) *
                           iVar8 + ((uint)*pbVar5 * 3 + (uint)*pbVar2 * 3 +
                                    (uint)pbVar5[2] + (uint)pbVar2[2] +
                                   (uint)pbVar5[1] * 2 + (uint)pbVar3[2] * 2 +
                                   (uint)pbVar2[1] * 2 + ((uint)*pbVar4 + (uint)*pbVar3) * 2 +
                                   (uint)pbVar4[2] * 2) * iVar7 + 0x8000 >> 0x10);
      pbVar15 = pbVar3 + 2;
      pbVar14 = pbVar4 + 2;
      pbVar12 = pbVar2 + 2;
      pbVar13 = pbVar5 + 2;
      pJVar16 = pJVar16 + 1;
      if (iVar6 != 0) {
        lVar17 = 0;
        iVar10 = iVar6;
        do {
          *pJVar16 = (JSAMPLE)(iVar7 * ((uint)pbVar5[lVar17 + 1] +
                                        (uint)pbVar2[lVar17 + 4] + (uint)pbVar2[lVar17 + 1] +
                                        ((uint)pbVar4[lVar17 + 4] +
                                        (uint)pbVar4[lVar17 + 1] +
                                        (uint)pbVar3[lVar17 + 4] + (uint)pbVar3[lVar17 + 1] +
                                        (uint)pbVar5[lVar17 + 3] + (uint)pbVar13[lVar17] +
                                        (uint)pbVar2[lVar17 + 3] + (uint)pbVar12[lVar17]) * 2 +
                                       (uint)pbVar5[lVar17 + 4]) +
                               iVar8 * ((uint)pbVar4[lVar17 + 3] + (uint)pbVar14[lVar17] +
                                       (uint)pbVar3[lVar17 + 3] + (uint)pbVar15[lVar17]) + 0x8000 >>
                              0x10);
          pJVar16 = pJVar16 + 1;
          lVar17 = lVar17 + 2;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
        pbVar13 = pbVar13 + lVar17;
        pbVar12 = pbVar12 + lVar17;
        pbVar14 = pbVar14 + lVar17;
        pbVar15 = pbVar15 + lVar17;
      }
      *pJVar16 = (JSAMPLE)(((uint)pbVar13[1] * 3 + (uint)pbVar12[1] * 3 +
                            (uint)pbVar13[-1] + (uint)pbVar12[-1] +
                           (uint)*pbVar13 * 2 + (uint)pbVar15[-1] * 2 +
                           (uint)*pbVar12 * 2 + ((uint)pbVar14[1] + (uint)pbVar15[1]) * 2 +
                           (uint)pbVar14[-1] * 2) * iVar7 +
                           ((uint)*pbVar14 + (uint)*pbVar15 + (uint)pbVar14[1] + (uint)pbVar15[1]) *
                           iVar8 + 0x8000 >> 0x10);
      lVar11 = lVar11 + 2;
      lVar9 = lVar9 + 1;
    } while (lVar11 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_smooth_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
			JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow;
  JDIMENSION colctr;
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  register JSAMPROW inptr0, inptr1, above_ptr, below_ptr, outptr;
  INT32 membersum, neighsum, memberscale, neighscale;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data - 1, cinfo->max_v_samp_factor + 2,
		    cinfo->image_width, output_cols * 2);

  /* We don't bother to form the individual "smoothed" input pixel values;
   * we can directly compute the output which is the average of the four
   * smoothed values.  Each of the four member pixels contributes a fraction
   * (1-8*SF) to its own smoothed image and a fraction SF to each of the three
   * other smoothed pixels, therefore a total fraction (1-5*SF)/4 to the final
   * output.  The four corner-adjacent neighbor pixels contribute a fraction
   * SF to just one smoothed pixel, or SF/4 to the final output; while the
   * eight edge-adjacent neighbors contribute SF to each of two smoothed
   * pixels, or SF/2 overall.  In order to use integer arithmetic, these
   * factors are scaled by 2^16 = 65536.
   * Also recall that SF = smoothing_factor / 1024.
   */

  memberscale = 16384 - cinfo->smoothing_factor * 80; /* scaled (1-5*SF)/4 */
  neighscale = cinfo->smoothing_factor * 16; /* scaled SF/4 */

  inrow = outrow = 0;
  while (inrow < cinfo->max_v_samp_factor) {
    outptr = output_data[outrow];
    inptr0 = input_data[inrow];
    inptr1 = input_data[inrow+1];
    above_ptr = input_data[inrow-1];
    below_ptr = input_data[inrow+2];

    /* Special case for first column: pretend column -1 is same as column 0 */
    membersum = GETJSAMPLE(*inptr0) + GETJSAMPLE(inptr0[1]) +
		GETJSAMPLE(*inptr1) + GETJSAMPLE(inptr1[1]);
    neighsum = GETJSAMPLE(*above_ptr) + GETJSAMPLE(above_ptr[1]) +
	       GETJSAMPLE(*below_ptr) + GETJSAMPLE(below_ptr[1]) +
	       GETJSAMPLE(*inptr0) + GETJSAMPLE(inptr0[2]) +
	       GETJSAMPLE(*inptr1) + GETJSAMPLE(inptr1[2]);
    neighsum += neighsum;
    neighsum += GETJSAMPLE(*above_ptr) + GETJSAMPLE(above_ptr[2]) +
		GETJSAMPLE(*below_ptr) + GETJSAMPLE(below_ptr[2]);
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr++ = (JSAMPLE) ((membersum + 32768) >> 16);
    inptr0 += 2; inptr1 += 2; above_ptr += 2; below_ptr += 2;

    for (colctr = output_cols - 2; colctr > 0; colctr--) {
      /* sum of pixels directly mapped to this output element */
      membersum = GETJSAMPLE(*inptr0) + GETJSAMPLE(inptr0[1]) +
		  GETJSAMPLE(*inptr1) + GETJSAMPLE(inptr1[1]);
      /* sum of edge-neighbor pixels */
      neighsum = GETJSAMPLE(*above_ptr) + GETJSAMPLE(above_ptr[1]) +
		 GETJSAMPLE(*below_ptr) + GETJSAMPLE(below_ptr[1]) +
		 GETJSAMPLE(inptr0[-1]) + GETJSAMPLE(inptr0[2]) +
		 GETJSAMPLE(inptr1[-1]) + GETJSAMPLE(inptr1[2]);
      /* The edge-neighbors count twice as much as corner-neighbors */
      neighsum += neighsum;
      /* Add in the corner-neighbors */
      neighsum += GETJSAMPLE(above_ptr[-1]) + GETJSAMPLE(above_ptr[2]) +
		  GETJSAMPLE(below_ptr[-1]) + GETJSAMPLE(below_ptr[2]);
      /* form final output scaled up by 2^16 */
      membersum = membersum * memberscale + neighsum * neighscale;
      /* round, descale and output it */
      *outptr++ = (JSAMPLE) ((membersum + 32768) >> 16);
      inptr0 += 2; inptr1 += 2; above_ptr += 2; below_ptr += 2;
    }

    /* Special case for last column */
    membersum = GETJSAMPLE(*inptr0) + GETJSAMPLE(inptr0[1]) +
		GETJSAMPLE(*inptr1) + GETJSAMPLE(inptr1[1]);
    neighsum = GETJSAMPLE(*above_ptr) + GETJSAMPLE(above_ptr[1]) +
	       GETJSAMPLE(*below_ptr) + GETJSAMPLE(below_ptr[1]) +
	       GETJSAMPLE(inptr0[-1]) + GETJSAMPLE(inptr0[1]) +
	       GETJSAMPLE(inptr1[-1]) + GETJSAMPLE(inptr1[1]);
    neighsum += neighsum;
    neighsum += GETJSAMPLE(above_ptr[-1]) + GETJSAMPLE(above_ptr[1]) +
		GETJSAMPLE(below_ptr[-1]) + GETJSAMPLE(below_ptr[1]);
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr = (JSAMPLE) ((membersum + 32768) >> 16);

    inrow += 2;
    outrow++;
  }
}